

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O2

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetFullName_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  static_string_view local_18;
  
  local_18.super_string_view._M_len = 0xb;
  local_18.super_string_view._M_str = ".framework/";
  cmStrCat<std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,std::__cxx11::string_const&>
            (__return_storage_ptr__,&this->Name,&local_18,&this->Name,&this->Suffix);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullName() const
    {
      return cmStrCat(this->Name, ".framework/"_s, this->Name, this->Suffix);
    }